

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

char * PHYSFS_getErrorByCode(PHYSFS_ErrorCode code)

{
  char *pcStack_10;
  PHYSFS_ErrorCode code_local;
  
  switch(code) {
  case PHYSFS_ERR_OK:
    pcStack_10 = "no error";
    break;
  case PHYSFS_ERR_OTHER_ERROR:
    pcStack_10 = "unknown error";
    break;
  case PHYSFS_ERR_OUT_OF_MEMORY:
    pcStack_10 = "out of memory";
    break;
  case PHYSFS_ERR_NOT_INITIALIZED:
    pcStack_10 = "not initialized";
    break;
  case PHYSFS_ERR_IS_INITIALIZED:
    pcStack_10 = "already initialized";
    break;
  case PHYSFS_ERR_ARGV0_IS_NULL:
    pcStack_10 = "argv[0] is NULL";
    break;
  case PHYSFS_ERR_UNSUPPORTED:
    pcStack_10 = "unsupported";
    break;
  case PHYSFS_ERR_PAST_EOF:
    pcStack_10 = "past end of file";
    break;
  case PHYSFS_ERR_FILES_STILL_OPEN:
    pcStack_10 = "files still open";
    break;
  case PHYSFS_ERR_INVALID_ARGUMENT:
    pcStack_10 = "invalid argument";
    break;
  case PHYSFS_ERR_NOT_MOUNTED:
    pcStack_10 = "not mounted";
    break;
  case PHYSFS_ERR_NOT_FOUND:
    pcStack_10 = "not found";
    break;
  case PHYSFS_ERR_SYMLINK_FORBIDDEN:
    pcStack_10 = "symlinks are forbidden";
    break;
  case PHYSFS_ERR_NO_WRITE_DIR:
    pcStack_10 = "write directory is not set";
    break;
  case PHYSFS_ERR_OPEN_FOR_READING:
    pcStack_10 = "file open for reading";
    break;
  case PHYSFS_ERR_OPEN_FOR_WRITING:
    pcStack_10 = "file open for writing";
    break;
  case PHYSFS_ERR_NOT_A_FILE:
    pcStack_10 = "not a file";
    break;
  case PHYSFS_ERR_READ_ONLY:
    pcStack_10 = "read-only filesystem";
    break;
  case PHYSFS_ERR_CORRUPT:
    pcStack_10 = "corrupted";
    break;
  case PHYSFS_ERR_SYMLINK_LOOP:
    pcStack_10 = "infinite symbolic link loop";
    break;
  case PHYSFS_ERR_IO:
    pcStack_10 = "i/o error";
    break;
  case PHYSFS_ERR_PERMISSION:
    pcStack_10 = "permission denied";
    break;
  case PHYSFS_ERR_NO_SPACE:
    pcStack_10 = "no space available for writing";
    break;
  case PHYSFS_ERR_BAD_FILENAME:
    pcStack_10 = "filename is illegal or insecure";
    break;
  case PHYSFS_ERR_BUSY:
    pcStack_10 = "tried to modify a file the OS needs";
    break;
  case PHYSFS_ERR_DIR_NOT_EMPTY:
    pcStack_10 = "directory isn\'t empty";
    break;
  case PHYSFS_ERR_OS_ERROR:
    pcStack_10 = "OS reported an error";
    break;
  case PHYSFS_ERR_DUPLICATE:
    pcStack_10 = "duplicate resource";
    break;
  case PHYSFS_ERR_BAD_PASSWORD:
    pcStack_10 = "bad password";
    break;
  case PHYSFS_ERR_APP_CALLBACK:
    pcStack_10 = "app callback reported error";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

PHYSFS_DECL const char *PHYSFS_getErrorByCode(PHYSFS_ErrorCode code)
{
    switch (code)
    {
        case PHYSFS_ERR_OK: return "no error";
        case PHYSFS_ERR_OTHER_ERROR: return "unknown error";
        case PHYSFS_ERR_OUT_OF_MEMORY: return "out of memory";
        case PHYSFS_ERR_NOT_INITIALIZED: return "not initialized";
        case PHYSFS_ERR_IS_INITIALIZED: return "already initialized";
        case PHYSFS_ERR_ARGV0_IS_NULL: return "argv[0] is NULL";
        case PHYSFS_ERR_UNSUPPORTED: return "unsupported";
        case PHYSFS_ERR_PAST_EOF: return "past end of file";
        case PHYSFS_ERR_FILES_STILL_OPEN: return "files still open";
        case PHYSFS_ERR_INVALID_ARGUMENT: return "invalid argument";
        case PHYSFS_ERR_NOT_MOUNTED: return "not mounted";
        case PHYSFS_ERR_NOT_FOUND: return "not found";
        case PHYSFS_ERR_SYMLINK_FORBIDDEN: return "symlinks are forbidden";
        case PHYSFS_ERR_NO_WRITE_DIR: return "write directory is not set";
        case PHYSFS_ERR_OPEN_FOR_READING: return "file open for reading";
        case PHYSFS_ERR_OPEN_FOR_WRITING: return "file open for writing";
        case PHYSFS_ERR_NOT_A_FILE: return "not a file";
        case PHYSFS_ERR_READ_ONLY: return "read-only filesystem";
        case PHYSFS_ERR_CORRUPT: return "corrupted";
        case PHYSFS_ERR_SYMLINK_LOOP: return "infinite symbolic link loop";
        case PHYSFS_ERR_IO: return "i/o error";
        case PHYSFS_ERR_PERMISSION: return "permission denied";
        case PHYSFS_ERR_NO_SPACE: return "no space available for writing";
        case PHYSFS_ERR_BAD_FILENAME: return "filename is illegal or insecure";
        case PHYSFS_ERR_BUSY: return "tried to modify a file the OS needs";
        case PHYSFS_ERR_DIR_NOT_EMPTY: return "directory isn't empty";
        case PHYSFS_ERR_OS_ERROR: return "OS reported an error";
        case PHYSFS_ERR_DUPLICATE: return "duplicate resource";
        case PHYSFS_ERR_BAD_PASSWORD: return "bad password";
        case PHYSFS_ERR_APP_CALLBACK: return "app callback reported error";
    } /* switch */

    return NULL;  /* don't know this error code. */
}